

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O3

int ffrsimll(fitsfile *fptr,int bitpix,int naxis,LONGLONG *naxes,int *status)

{
  long lVar1;
  fitsfile *fptr_00;
  undefined4 uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int onaxis;
  int obitpix;
  fitsfile *local_430;
  LONGLONG *local_428;
  uint local_420;
  int local_41c;
  long gcount;
  long pcount;
  char comment [73];
  int extend;
  int simple;
  char keyname [75];
  LONGLONG onaxes [99];
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar3 = ffrdef(fptr,status), 0 < iVar3))
    goto LAB_0011db9d;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  iVar3 = ffghprll(fptr,99,&simple,&obitpix,&onaxis,onaxes,&pcount,&gcount,&extend,status);
  if (0 < iVar3) goto LAB_0011db9d;
  if (bitpix == 10) {
    uVar8 = 8;
  }
  else if (bitpix == 0x14) {
    uVar8 = 0x10;
  }
  else if (bitpix == 0x28) {
    uVar8 = 0x20;
  }
  else {
    iVar3 = 0x40;
    if (bitpix != 0x50) {
      iVar3 = bitpix;
    }
    uVar8 = (ulong)iVar3;
    if ((((0x38 < iVar3 - 8U) || ((0x100000001000101U >> ((ulong)(iVar3 - 8U) & 0x3f) & 1) == 0)) &&
        (iVar3 != -0x40)) && (iVar3 != -0x20)) {
      snprintf(keyname,0x51,"Illegal value for BITPIX keyword: %d",bitpix);
      ffpmsg(keyname);
      *status = 0xd3;
      return 0xd3;
    }
  }
  if (999 < (uint)naxis) {
    snprintf(keyname,0x51,"Illegal value for NAXIS keyword: %d",(ulong)(uint)naxis);
    ffpmsg(keyname);
    *status = 0xd4;
    return 0xd4;
  }
  uVar7 = (ulong)(naxis != 0);
  if (naxis != 0) {
    uVar5 = 0;
    do {
      lVar6 = naxes[uVar5];
      if (lVar6 < 0) {
        snprintf(keyname,0x51,"Illegal value for NAXIS%d keyword: %.0f",SUB84((double)lVar6,0),
                 (ulong)((int)uVar5 + 1));
        ffpmsg(keyname);
        *status = 0xd5;
        return 0xd5;
      }
      uVar7 = uVar7 * lVar6;
      uVar5 = uVar5 + 1;
    } while ((uint)naxis != uVar5);
  }
  if ((ulong)(uint)onaxis == 0) {
    lVar6 = 0;
  }
  else {
    lVar6 = 1;
    if (0 < onaxis) {
      uVar5 = 0;
      do {
        lVar6 = lVar6 * onaxes[uVar5];
        uVar5 = uVar5 + 1;
      } while ((uint)onaxis != uVar5);
    }
    uVar9 = -obitpix;
    if (0 < obitpix) {
      uVar9 = obitpix;
    }
    lVar6 = (long)((ulong)(uVar9 >> 3) * (lVar6 + pcount) * gcount + 0xb3f) / 0xb40;
  }
  uVar5 = -uVar8;
  if (0 < (long)uVar8) {
    uVar5 = uVar8;
  }
  lVar1 = (long)((uVar5 >> 3 & 0x1fffffff) * gcount * (pcount + uVar7) + 0xb3f) / 0xb40;
  if (lVar1 - lVar6 == 0 || lVar1 < lVar6) {
    if (lVar6 - lVar1 != 0 && lVar1 <= lVar6) {
      iVar3 = ffdblk(fptr,lVar6 - lVar1,status);
      goto LAB_0011dd84;
    }
  }
  else {
    iVar3 = ffiblk(fptr,lVar1 - lVar6,1,status);
LAB_0011dd84:
    if (0 < iVar3) goto LAB_0011db9d;
  }
  comment[0] = '&';
  comment[1] = '\0';
  if (uVar8 != (long)obitpix) {
    ffmkyj(fptr,"BITPIX",uVar8,comment,status);
  }
  uVar9 = naxis;
  local_41c = bitpix;
  if (onaxis != naxis) {
    ffmkyj(fptr,"NAXIS",(ulong)(uint)naxis,comment,status);
    uVar9 = onaxis;
  }
  uVar4 = naxis;
  if ((int)uVar9 < naxis) {
    uVar4 = uVar9;
  }
  if (0 < (int)uVar4) {
    uVar8 = 0;
    local_428 = naxes;
    local_420 = naxis;
    do {
      uVar7 = uVar8 + 1;
      ffkeyn("NAXIS",(int)uVar7,keyname,status);
      ffmkyj(fptr,keyname,local_428[uVar8],comment,status);
      naxes = local_428;
      uVar8 = uVar7;
      naxis = local_420;
      uVar9 = onaxis;
    } while (uVar4 != uVar7);
  }
  local_430 = fptr;
  if ((int)uVar9 < naxis) {
    builtin_strncpy(comment,"length of data axis",0x14);
    local_428 = naxes + (int)uVar9;
    lVar6 = 0;
    do {
      ffkeyn("NAXIS",uVar9 + 1 + (int)lVar6,keyname,status);
      ffikyj(fptr,keyname,local_428[lVar6],comment,status);
      lVar6 = lVar6 + 1;
    } while ((ulong)(uint)naxis - (long)(int)uVar9 != lVar6);
  }
  else if (naxis < (int)uVar9) {
    do {
      naxis = naxis + 1;
      ffkeyn("NAXIS",naxis,keyname,status);
      ffdkey(fptr,keyname,status);
    } while (naxis < onaxis);
  }
  fptr_00 = local_430;
  if (local_41c < 0x28) {
    if (local_41c == 10) {
      builtin_strncpy(comment + 0x1c," signed byte",0xd);
      uVar9 = 0xc0600000;
      goto LAB_0011e055;
    }
    if (local_41c == 0x14) {
      builtin_strncpy(comment + 0x1c," unsigned short",0x10);
      uVar9 = 0x40e00000;
      goto LAB_0011e055;
    }
  }
  else {
    if (local_41c == 0x28) {
      builtin_strncpy(comment + 0x1c," unsigned long",0xf);
      uVar9 = 0x41e00000;
    }
    else {
      if (local_41c != 0x50) goto LAB_0011e0a9;
      builtin_strncpy(comment + 0x1c," unsigned long long",0x14);
      uVar9 = 0x43e00000;
    }
LAB_0011e055:
    builtin_strncpy(comment,"offset data range to that of",0x1c);
    ffukyg(local_430,"BZERO",(double)((ulong)uVar9 << 0x20),0,comment,status);
    uVar2 = comment._20_4_;
    builtin_strncpy(comment,"default scaling factor",0x17);
    comment[0x17] = SUB41(uVar2,3);
    ffukyg(fptr_00,"BSCALE",1.0,0,comment,status);
  }
LAB_0011e0a9:
  ffrdef(fptr_00,status);
LAB_0011db9d:
  return *status;
}

Assistant:

int ffrsimll(fitsfile *fptr,    /* I - FITS file pointer           */
           int bitpix,          /* I - bits per pixel              */
           int naxis,           /* I - number of axes in the array */
           LONGLONG *naxes,     /* I - size of each axis           */
           int *status)         /* IO - error status               */
/*
   resize an existing primary array or IMAGE extension.
*/
{
    int ii, simple, obitpix, onaxis, extend, nmodify;
    long  nblocks, longval;
    long pcount, gcount, longbitpix;
    LONGLONG onaxes[99], newsize, oldsize;
    char comment[FLEN_COMMENT], keyname[FLEN_KEYWORD], message[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
         /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    /* get current image size parameters */
    if (ffghprll(fptr, 99, &simple, &obitpix, &onaxis, onaxes, &pcount,
               &gcount, &extend, status) > 0)
        return(*status);

    longbitpix = bitpix;

    /* test for the 4 special cases that represent unsigned integers 
       or signed bytes */
    if (longbitpix == USHORT_IMG)
        longbitpix = SHORT_IMG;
    else if (longbitpix == ULONG_IMG)
        longbitpix = LONG_IMG;
    else if (longbitpix == SBYTE_IMG)
        longbitpix = BYTE_IMG;
    else if (longbitpix == ULONGLONG_IMG)
        longbitpix = LONGLONG_IMG;

    /* test that the new values are legal */

    if (longbitpix != BYTE_IMG && longbitpix != SHORT_IMG && 
        longbitpix != LONG_IMG && longbitpix != LONGLONG_IMG &&
        longbitpix != FLOAT_IMG && longbitpix != DOUBLE_IMG)
    {
        snprintf(message, FLEN_ERRMSG,
        "Illegal value for BITPIX keyword: %d", bitpix);
        ffpmsg(message);
        return(*status = BAD_BITPIX);
    }

    if (naxis < 0 || naxis > 999)
    {
        snprintf(message, FLEN_ERRMSG,
        "Illegal value for NAXIS keyword: %d", naxis);
        ffpmsg(message);
        return(*status = BAD_NAXIS);
    }

    if (naxis == 0)
        newsize = 0;
    else
        newsize = 1;

    for (ii = 0; ii < naxis; ii++)
    {
        if (naxes[ii] < 0)
        {
            snprintf(message, FLEN_ERRMSG,
            "Illegal value for NAXIS%d keyword: %.0f", ii + 1,  (double) (naxes[ii]));
            ffpmsg(message);
            return(*status = BAD_NAXES);
        }

        newsize *= naxes[ii];  /* compute new image size, in pixels */
    }

    /* compute size of old image, in bytes */

    if (onaxis == 0)
        oldsize = 0;
    else
    {
        oldsize = 1;
        for (ii = 0; ii < onaxis; ii++)
            oldsize *= onaxes[ii];  
        oldsize = (oldsize + pcount) * gcount * (abs(obitpix) / 8);
    }

    oldsize = (oldsize + 2879) / 2880; /* old size, in blocks */

    newsize = (newsize + pcount) * gcount * (labs(longbitpix) / 8);
    newsize = (newsize + 2879) / 2880; /* new size, in blocks */

    if (newsize > oldsize)   /* have to insert new blocks for image */
    {
        nblocks = (long) (newsize - oldsize);
        if (ffiblk(fptr, nblocks, 1, status) > 0)  
            return(*status);
    }
    else if (oldsize > newsize)  /* have to delete blocks from image */
    {
        nblocks = (long) (oldsize - newsize);
        if (ffdblk(fptr, nblocks, status) > 0)  
            return(*status);
    }

    /* now update the header keywords */

    strcpy(comment,"&");  /* special value to leave comments unchanged */

    if (longbitpix != obitpix)
    {                         /* update BITPIX value */
        ffmkyj(fptr, "BITPIX", longbitpix, comment, status);
    }

    if (naxis != onaxis)
    {                        /* update NAXIS value */
        longval = naxis;
        ffmkyj(fptr, "NAXIS", longval, comment, status);
    }

    /* modify the existing NAXISn keywords */
    nmodify = minvalue(naxis, onaxis); 
    for (ii = 0; ii < nmodify; ii++)
    {
        ffkeyn("NAXIS", ii+1, keyname, status);
        ffmkyj(fptr, keyname, naxes[ii], comment, status);
    }

    if (naxis > onaxis)  /* insert additional NAXISn keywords */
    {
        strcpy(comment,"length of data axis");  
        for (ii = onaxis; ii < naxis; ii++)
        {
            ffkeyn("NAXIS", ii+1, keyname, status);
            ffikyj(fptr, keyname, naxes[ii], comment, status);
        }
    }
    else if (onaxis > naxis) /* delete old NAXISn keywords */
    {
        for (ii = naxis; ii < onaxis; ii++)
        {
            ffkeyn("NAXIS", ii+1, keyname, status);
            ffdkey(fptr, keyname, status);
        }
    }

    /* Update the BSCALE and BZERO keywords, if an unsigned integer image
       or a signed byte image.  */
    if (bitpix == USHORT_IMG)
    {
        strcpy(comment, "offset data range to that of unsigned short");
        ffukyg(fptr, "BZERO", 32768., 0, comment, status);
        strcpy(comment, "default scaling factor");
        ffukyg(fptr, "BSCALE", 1.0, 0, comment, status);
    }
    else if (bitpix == ULONG_IMG)
    {
        strcpy(comment, "offset data range to that of unsigned long");
        ffukyg(fptr, "BZERO", 2147483648., 0, comment, status);
        strcpy(comment, "default scaling factor");
        ffukyg(fptr, "BSCALE", 1.0, 0, comment, status);
    }
    else if (bitpix == ULONGLONG_IMG)
    {
        strcpy(comment, "offset data range to that of unsigned long long");
        ffukyg(fptr, "BZERO", 9223372036854775808., 0, comment, status);
        strcpy(comment, "default scaling factor");
        ffukyg(fptr, "BSCALE", 1.0, 0, comment, status);
    }
    else if (bitpix == SBYTE_IMG)
    {
        strcpy(comment, "offset data range to that of signed byte");
        ffukyg(fptr, "BZERO", -128., 0, comment, status);
        strcpy(comment, "default scaling factor");
        ffukyg(fptr, "BSCALE", 1.0, 0, comment, status);
    }

    /* re-read the header, to make sure structures are updated */
    ffrdef(fptr, status);
    return(*status);
}